

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token)

{
  _Elt_pointer ppVVar1;
  Location pCVar2;
  bool bVar3;
  _Elt_pointer ppVVar4;
  _Elt_pointer ppVVar5;
  Value decoded;
  Value local_40;
  
  local_40._8_2_ = 0;
  local_40.comments_ = (CommentInfo *)0x0;
  local_40.start_ = 0;
  local_40.limit_ = 0;
  bVar3 = decodeDouble(this,token,&local_40);
  if (bVar3) {
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar4 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swapPayload(ppVVar4[-1],&local_40);
    ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar1 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar5 = ppVVar4;
    if (ppVVar4 == ppVVar1) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar2 = this->begin_;
    ppVVar5[-1]->start_ = (long)token->start_ - (long)pCVar2;
    if (ppVVar4 == ppVVar1) {
      ppVVar4 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar4[-1]->limit_ = (long)token->end_ - (long)pCVar2;
  }
  Value::~Value(&local_40);
  return bVar3;
}

Assistant:

bool OurReader::decodeDouble(Token& token) {
  Value decoded;
  if (!decodeDouble(token, decoded))
    return false;
  currentValue().swapPayload(decoded);
  currentValue().setOffsetStart(token.start_ - begin_);
  currentValue().setOffsetLimit(token.end_ - begin_);
  return true;
}